

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O1

Value * soul::generateWaveform(Value *__return_storage_ptr__,Annotation *annotation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int64_t iVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  Triangle g_2;
  Sine g;
  Square g_3;
  string local_118;
  double local_f8;
  double local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Generator local_48;
  
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"sinewave","");
  bVar2 = Annotation::getBool(annotation,&local_118,false);
  bVar3 = true;
  if (!bVar2) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sine","");
    bVar3 = Annotation::getBool(annotation,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 == false) {
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"sawtooth","");
    bVar2 = Annotation::getBool(annotation,&local_118,false);
    bVar3 = true;
    if (!bVar2) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"saw","");
      bVar3 = Annotation::getBool(annotation,&local_88,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 == false) {
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"triangle","");
      bVar3 = Annotation::getBool(annotation,&local_118,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        local_118._M_string_length = 0;
        local_118.field_2._M_allocated_capacity = 0;
        local_118._M_dataplus._M_p = (pointer)&PTR__Generator_002dacc0;
        local_118.field_2._8_8_ = 0x3ff0000000000000;
        local_c8.field_2._M_allocated_capacity = 0x636e657571657266;
        local_c8.field_2._8_2_ = 0x79;
        local_c8._M_string_length = 9;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_f0 = Annotation::getDouble(annotation,&local_c8,0.0);
        local_e8._M_string_length = 4;
        local_e8.field_2._M_allocated_capacity._0_5_ = 0x65746172;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_f8 = Annotation::getDouble(annotation,&local_e8,0.0);
        local_a8.field_2._M_allocated_capacity = 0x656d6172466d756e;
        local_a8.field_2._8_2_ = 0x73;
        local_a8._M_string_length = 9;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        iVar4 = Annotation::getInt64(annotation,&local_a8,0);
        generateWaveform(__return_storage_ptr__,local_f0,local_f8,iVar4,(Generator *)&local_118,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        uVar5 = local_c8.field_2._M_allocated_capacity;
        _Var6._M_p = local_c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_001a07cb;
      }
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"squarewave","");
      bVar2 = Annotation::getBool(annotation,&local_118,false);
      bVar3 = true;
      if (!bVar2) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"square","");
        bVar3 = Annotation::getBool(annotation,&local_a8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (bVar3 == false) {
        (__return_storage_ptr__->packedData).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->packedData).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->packedData).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
             (_func_int **)&PTR__SimpleStringDictionary_002d4330;
        (__return_storage_ptr__->value).type.content.object = (Object *)0x0;
        (__return_storage_ptr__->value).type.allocator = (Allocator *)0x0;
        (__return_storage_ptr__->value).data = (uint8_t *)0x0;
        (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->dictionary).strings.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->dictionary).strings.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 1) = 0;
        (__return_storage_ptr__->value).stringDictionary =
             &(__return_storage_ptr__->dictionary).super_StringDictionary;
        return __return_storage_ptr__;
      }
      local_48.phaseIncrement = 0.0;
      local_48.currentPhase = 0.0;
      local_48._vptr_Generator = (_func_int **)&PTR__Generator_002dad18;
      local_118.field_2._M_allocated_capacity = 0x636e657571657266;
      local_118.field_2._8_2_ = 0x79;
      local_118._M_string_length = 9;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      local_f0 = Annotation::getDouble(annotation,&local_118,0.0);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 4;
      local_c8.field_2._M_allocated_capacity._0_5_ = 0x65746172;
      local_f8 = Annotation::getDouble(annotation,&local_c8,0.0);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8.field_2._M_allocated_capacity = 0x656d6172466d756e;
      local_e8.field_2._8_2_ = 0x73;
      local_e8._M_string_length = 9;
      iVar4 = Annotation::getInt64(annotation,&local_e8,0);
      generateWaveform(__return_storage_ptr__,local_f0,local_f8,iVar4,&local_48,2);
    }
    else {
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)&PTR__Generator_002dac68;
      local_118.field_2._M_allocated_capacity = 0x636e657571657266;
      local_118.field_2._8_2_ = 0x79;
      local_118._M_string_length = 9;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      local_f0 = Annotation::getDouble(annotation,&local_118,0.0);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 4;
      local_c8.field_2._M_allocated_capacity._0_5_ = 0x65746172;
      local_f8 = Annotation::getDouble(annotation,&local_c8,0.0);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8.field_2._M_allocated_capacity = 0x656d6172466d756e;
      local_e8.field_2._8_2_ = 0x73;
      local_e8._M_string_length = 9;
      iVar4 = Annotation::getInt64(annotation,&local_e8,0);
      generateWaveform(__return_storage_ptr__,local_f0,local_f8,iVar4,(Generator *)&local_a8,2);
    }
  }
  else {
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8._M_dataplus._M_p = (pointer)&PTR__Generator_002dac18;
    local_118.field_2._M_allocated_capacity = 0x636e657571657266;
    local_118.field_2._8_2_ = 0x79;
    local_118._M_string_length = 9;
    local_118._M_dataplus._M_p = (pointer)paVar1;
    local_f0 = Annotation::getDouble(annotation,&local_118,0.0);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 4;
    local_c8.field_2._M_allocated_capacity._0_5_ = 0x65746172;
    local_f8 = Annotation::getDouble(annotation,&local_c8,0.0);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8.field_2._M_allocated_capacity = 0x656d6172466d756e;
    local_e8.field_2._8_2_ = 0x73;
    local_e8._M_string_length = 9;
    iVar4 = Annotation::getInt64(annotation,&local_e8,0);
    generateWaveform(__return_storage_ptr__,local_f0,local_f8,iVar4,(Generator *)&local_a8,1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  uVar5 = local_118.field_2._M_allocated_capacity;
  _Var6._M_p = local_118._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
LAB_001a07cb:
  operator_delete(_Var6._M_p,uVar5 + 1);
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value generateWaveform (const Annotation& annotation)
{
    if (annotation.getBool ("sinewave") || annotation.getBool ("sine"))
        return generateWaveform<WaveGenerators::Sine> (annotation, 1);

    if (annotation.getBool ("sawtooth") || annotation.getBool ("saw"))
        return generateWaveform<WaveGenerators::Saw> (annotation, 2);

    if (annotation.getBool ("triangle"))
        return generateWaveform<WaveGenerators::Triangle> (annotation, 2);

    if (annotation.getBool ("squarewave") || annotation.getBool ("square"))
        return generateWaveform<WaveGenerators::Square> (annotation, 2);

    return {};
}